

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-misc.c
# Opt level: O2

int greatest_name_match(char *name,char *filter,int res_if_none)

{
  int iVar1;
  size_t __n;
  size_t sVar2;
  char *__s1;
  
  if (name == (char *)0x0) {
    return (int)filter;
  }
  __n = strlen(name);
  if (__n != 0) {
    if ((greatest_info.exact_name_match == '\0') ||
       (sVar2 = strlen(greatest_info.name_buf), sVar2 == __n)) {
      for (__s1 = greatest_info.name_buf; *__s1 != '\0'; __s1 = __s1 + 1) {
        if ((*__s1 == *name) && (iVar1 = strncmp(__s1,name,__n), iVar1 == 0)) {
          return 1;
        }
      }
    }
    return 0;
  }
  return (int)filter;
}

Assistant:

int main(int argc, char **argv) {
    GREATEST_MAIN_BEGIN(); /* command-line arguments, initialization. */

    /* If tests are run outside of a suite, a default suite is used. */
    RUN_TEST(test_example);
    RUN_TEST(calling_fread);
    RUN_TEST(calling_calloc_0_0);
    RUN_TEST(calling_malloc_0);
    RUN_TEST(calling_enum_lookup);

    GREATEST_MAIN_END(); /* display results */
}